

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void write_density(bool write_x,bool write_y,bool write_z,string *x_folder,string *y_folder,
                  string *z_folder,bool write_ions,bool scale_j)

{
  undefined1 uVar1;
  int i_00;
  _Ios_Openmode mode_00;
  long *this;
  char *pcVar2;
  spatial_region *psVar3;
  ofstream *poVar4;
  reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  byte in_DL;
  byte in_SIL;
  byte in_DIL;
  byte in_stack_00000008;
  byte in_stack_00000010;
  ofstream fout_irho_1;
  openmode mode_1;
  ofstream fout_irho;
  int i_1;
  string file_name;
  int n;
  char s_cmr [20];
  openmode mode;
  int ii;
  int i;
  int onx0;
  int onx;
  string file_name_z;
  string file_name_y;
  string file_name_x;
  ofstream *pof_z;
  ofstream *pof_y;
  ofstream *pof_x;
  string file_name_suffix;
  openmode in_stack_fffffffffffff928;
  int in_stack_fffffffffffff92c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff938;
  int in_stack_fffffffffffff950;
  undefined2 in_stack_fffffffffffff954;
  undefined1 in_stack_fffffffffffff956;
  undefined1 in_stack_fffffffffffff957;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff958;
  spatial_region *in_stack_fffffffffffff960;
  ofstream *in_stack_fffffffffffff968;
  pointer in_stack_fffffffffffff970;
  ofstream *in_stack_fffffffffffff978;
  spatial_region *in_stack_fffffffffffff980;
  undefined8 in_stack_fffffffffffff9a0;
  ofstream *in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  ofstream *in_stack_fffffffffffff9b8;
  spatial_region *in_stack_fffffffffffff9c0;
  openmode in_stack_fffffffffffff9d0;
  OutputIterations *in_stack_fffffffffffff9d8;
  undefined1 local_5f0 [516];
  _Ios_Openmode local_3ec;
  undefined1 local_3e8 [516];
  int local_1e4;
  string local_1e0 [36];
  int local_1bc;
  char local_1b8 [20];
  _Ios_Openmode local_1a4;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [48];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  ofstream *local_60;
  spatial_region *local_58;
  ofstream *local_50;
  string local_48 [38];
  byte local_22;
  byte local_21;
  byte local_3;
  byte local_2;
  byte local_1;
  
  local_1 = in_DIL & 1;
  local_2 = in_SIL & 1;
  local_3 = in_DL & 1;
  local_21 = in_stack_00000008 & 1;
  local_22 = in_stack_00000010 & 1;
  OutputIterations::get_current_iteration_string_abi_cxx11_(in_stack_fffffffffffff9d8);
  local_50 = (ofstream *)0x0;
  local_58 = (spatial_region *)0x0;
  local_60 = (ofstream *)0x0;
  std::operator+(in_stack_fffffffffffff958,
                 (char *)CONCAT17(in_stack_fffffffffffff957,
                                  CONCAT16(in_stack_fffffffffffff956,
                                           CONCAT24(in_stack_fffffffffffff954,
                                                    in_stack_fffffffffffff950))));
  std::operator+(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::operator+(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_c0);
  std::operator+(in_stack_fffffffffffff958,
                 (char *)CONCAT17(in_stack_fffffffffffff957,
                                  CONCAT16(in_stack_fffffffffffff956,
                                           CONCAT24(in_stack_fffffffffffff954,
                                                    in_stack_fffffffffffff950))));
  std::operator+(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::operator+(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_130);
  std::operator+(in_stack_fffffffffffff958,
                 (char *)CONCAT17(in_stack_fffffffffffff957,
                                  CONCAT16(in_stack_fffffffffffff956,
                                           CONCAT24(in_stack_fffffffffffff954,
                                                    in_stack_fffffffffffff950))));
  std::operator+(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::operator+(in_stack_fffffffffffff938,in_stack_fffffffffffff930);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  for (local_19c = 0; local_19c < n_sr; local_19c = local_19c + 1) {
    if (mpi_rank == local_19c) {
      if ((local_1 & 1) != 0) {
        this = (long *)operator_new(0x200);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        std::ofstream::ofstream(this,pcVar2,output_mode);
        local_50 = (ofstream *)this;
      }
      if ((local_2 & 1) != 0) {
        psVar3 = (spatial_region *)operator_new(0x200);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        std::ofstream::ofstream(psVar3,pcVar2,output_mode);
        local_58 = psVar3;
      }
      if ((local_3 & 1) != 0) {
        poVar4 = (ofstream *)operator_new(0x200);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        std::ofstream::ofstream(poVar4,pcVar2,output_mode);
        local_60 = poVar4;
      }
      if (local_19c == n_sr + -1) {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)local_19c);
        local_194 = *pvVar5;
      }
      else {
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)local_19c);
        local_194 = *pvVar5 - nx_ich / 2;
      }
      if (local_19c == 0) {
        local_198 = 0;
      }
      else {
        local_198 = nx_ich / 2;
      }
      if ((local_22 & 1) != 0) {
        std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                  ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x13aaef);
        spatial_region::scale_j(in_stack_fffffffffffff960,(double)in_stack_fffffffffffff958);
      }
      std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x13ab1b);
      in_stack_fffffffffffff928 = output_mode;
      spatial_region::fout_rho
                (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,
                 (ofstream *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                 in_stack_fffffffffffff9a8,(int)((ulong)in_stack_fffffffffffff9a0 >> 0x20),
                 (int)in_stack_fffffffffffff9a0,in_stack_fffffffffffff9d0);
      if ((local_50 != (ofstream *)0x0) && (local_50 != (ofstream *)0x0)) {
        (**(code **)(*(long *)local_50 + 8))();
      }
      if ((local_58 != (spatial_region *)0x0) &&
         (in_stack_fffffffffffff9c0 = local_58, local_58 != (spatial_region *)0x0)) {
        (**(code **)(*(long *)local_58 + 8))();
      }
      if ((local_60 != (ofstream *)0x0) &&
         (in_stack_fffffffffffff9b8 = local_60, local_60 != (ofstream *)0x0)) {
        (**(code **)(*(long *)local_60 + 8))();
      }
    }
    MPI_Barrier(&ompi_mpi_comm_world);
  }
  local_50 = (ofstream *)0x0;
  local_58 = (spatial_region *)0x0;
  local_60 = (ofstream *)0x0;
  local_1a0 = get_sr_for_x(6.36997849051827e-318);
  if (mpi_rank == local_1a0) {
    local_1a4 = std::operator|(output_mode,_S_app);
    if ((local_1 & 1) != 0) {
      poVar4 = (ofstream *)operator_new(0x200);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(poVar4,pcVar2,local_1a4);
      local_50 = poVar4;
    }
    if ((local_2 & 1) != 0) {
      psVar3 = (spatial_region *)operator_new(0x200);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(psVar3,pcVar2,local_1a4);
      local_58 = psVar3;
    }
    if ((local_3 & 1) != 0) {
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                operator_new(0x200);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(this_00,pcVar2,local_1a4);
      local_60 = (ofstream *)this_00;
    }
    in_stack_fffffffffffff970 =
         std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                   ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x13ae0b);
    in_stack_fffffffffffff978 = local_50;
    in_stack_fffffffffffff980 = local_58;
    get_xindex_in_sr((double)in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
    spatial_region::fout_rho_yzplane
              (in_stack_fffffffffffff980,in_stack_fffffffffffff978,
               (ofstream *)in_stack_fffffffffffff970,in_stack_fffffffffffff968,
               (int)((ulong)in_stack_fffffffffffff960 >> 0x20),(openmode)in_stack_fffffffffffff960);
    if ((local_50 != (ofstream *)0x0) &&
       (in_stack_fffffffffffff968 = local_50, local_50 != (ofstream *)0x0)) {
      (**(code **)(*(long *)local_50 + 8))();
    }
    if ((local_58 != (spatial_region *)0x0) &&
       (in_stack_fffffffffffff960 = local_58, local_58 != (spatial_region *)0x0)) {
      (**(code **)(*(long *)local_58 + 8))();
    }
    if ((local_60 != (ofstream *)0x0) &&
       (in_stack_fffffffffffff958 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
       local_60 != (ofstream *)0x0)) {
      (**(code **)(*(long *)local_60 + 8))();
    }
  }
  if (((local_21 & 1) != 0) &&
     ((uVar1 = std::operator==(in_stack_fffffffffffff930,
                               (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928)
                              ), (bool)uVar1 ||
      (in_stack_fffffffffffff956 =
            std::operator==(in_stack_fffffffffffff930,
                            (char *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928)),
      (bool)in_stack_fffffffffffff956)))) {
    for (local_1bc = 0; local_1bc < n_ion_populations; local_1bc = local_1bc + 1) {
      sprintf(local_1b8,"%g",icmr[local_1bc]);
      std::operator+(in_stack_fffffffffffff958,
                     (char *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff956,
                                                     CONCAT24(in_stack_fffffffffffff954,
                                                              in_stack_fffffffffffff950))));
      std::__cxx11::string::operator+=(local_1e0,local_1b8);
      std::__cxx11::string::operator+=(local_1e0,"_");
      std::__cxx11::string::operator+=(local_1e0,local_48);
      for (local_1e4 = 0; local_1e4 < n_sr; local_1e4 = local_1e4 + 1) {
        if (mpi_rank == local_1e4) {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          std::ofstream::ofstream(local_3e8,pcVar2,output_mode);
          if (local_1e4 == n_sr + -1) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)local_1e4);
            local_194 = *pvVar5;
          }
          else {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&nx_sr,(long)local_1e4);
            in_stack_fffffffffffff950 = *pvVar5;
            local_194 = in_stack_fffffffffffff950 - nx_ich / 2;
          }
          if (local_1e4 == 0) {
            local_198 = 0;
          }
          else {
            local_198 = nx_ich / 2;
          }
          std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                    ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x13b119);
          spatial_region::fout_irho
                    (in_stack_fffffffffffff980,(int)((ulong)in_stack_fffffffffffff978 >> 0x20),
                     (ofstream *)in_stack_fffffffffffff970,
                     (int)((ulong)in_stack_fffffffffffff968 >> 0x20),(int)in_stack_fffffffffffff968,
                     (openmode)((ulong)in_stack_fffffffffffff960 >> 0x20));
          std::ofstream::close();
          std::ofstream::~ofstream(local_3e8);
        }
        MPI_Barrier(&ompi_mpi_comm_world);
      }
      i_00 = get_sr_for_x(6.37690035021651e-318);
      local_1a0 = i_00;
      if (mpi_rank == i_00) {
        mode_00 = std::operator|(output_mode,_S_app);
        local_3ec = mode_00;
        pcVar2 = (char *)std::__cxx11::string::c_str();
        std::ofstream::ofstream(local_5f0,pcVar2,local_3ec);
        std::unique_ptr<spatial_region,_std::default_delete<spatial_region>_>::operator->
                  ((unique_ptr<spatial_region,_std::default_delete<spatial_region>_> *)0x13b242);
        get_xindex_in_sr((double)in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
        spatial_region::fout_irho_yzplane
                  (in_stack_fffffffffffff960,(int)((ulong)in_stack_fffffffffffff958 >> 0x20),
                   (ofstream *)
                   CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffff956,
                                           CONCAT24(in_stack_fffffffffffff954,
                                                    in_stack_fffffffffffff950))),i_00,mode_00);
        std::ofstream::close();
        std::ofstream::~ofstream(local_5f0);
      }
      std::__cxx11::string::~string(local_1e0);
    }
  }
  std::__cxx11::string::~string(local_150);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void write_density(bool write_x, bool write_y, bool write_z,
        std::string x_folder, std::string y_folder, std::string z_folder,
        bool write_ions = false, bool scale_j = false)
{
    std::string file_name_suffix = output_iterations.get_current_iteration_string();
    ofstream* pof_x = 0;
    ofstream* pof_y = 0;
    ofstream* pof_z = 0;

    string file_name_x = data_folder + "/" + x_folder + file_name_suffix;
    string file_name_y = data_folder + "/" + y_folder + file_name_suffix;
    string file_name_z = data_folder + "/" + z_folder + file_name_suffix;

    int onx;
    int onx0;
    for(int i=0;i<n_sr;i++)
    {
        if (mpi_rank == i) {
            if (write_x) {
                pof_x = new ofstream(file_name_x.c_str(), output_mode);
            }

            if (write_y) {
                pof_y = new ofstream(file_name_y.c_str(), output_mode);
            }
            if (write_z) {
                pof_z = new ofstream(file_name_z.c_str(), output_mode);
            }

            if(i==n_sr-1)
                onx = nx_sr[i];
            else
                onx = nx_sr[i]-nx_ich/2;
            if(i==0)
                onx0 = 0;
            else
                onx0 = nx_ich/2;
            if (scale_j) {
                psr->scale_j(dx / dt);
            }
            psr->fout_rho(pof_x,pof_y,pof_z,onx0,onx, output_mode);

            if (pof_x) delete pof_x;
            if (pof_y) delete pof_y;
            if (pof_z) delete pof_z;
        }
        MPI_Barrier(MPI_COMM_WORLD);
    }

    pof_x = 0;
    pof_y = 0;
    pof_z = 0;
    
    int ii = get_sr_for_x(xlength-x0fout);
    if (mpi_rank == ii) {
        ios_base::openmode mode = output_mode | ios_base::app;
        if (write_x) {
            pof_x = new ofstream(file_name_x.c_str(), mode);
        }
        if (write_y) {
            pof_y = new ofstream(file_name_y.c_str(), mode);
        }
        if (write_z) {
            pof_z = new ofstream(file_name_z.c_str(), mode);
        }
        psr->fout_rho_yzplane(pof_x,pof_y,pof_z,get_xindex_in_sr(xlength-x0fout, ii), mode);
        if (pof_x) delete pof_x;
        if (pof_y) delete pof_y;
        if (pof_z) delete pof_z;
    }

    if (write_ions && (ions=="on" || ions=="positrons"))
    {
        char s_cmr[20];
        for (int n=0;n<n_ion_populations;n++)
        {
            sprintf(s_cmr,"%g",icmr[n]);
            string file_name = data_folder+"/irho_";
            file_name += s_cmr;
            file_name += "_";
            file_name += file_name_suffix;
            for(int i=0;i<n_sr;i++)
            {
                if (mpi_rank == i) {
                    ofstream fout_irho(file_name.c_str(), output_mode);
                    if(i==n_sr-1)
                        onx = nx_sr[i];
                    else
                        onx = nx_sr[i]-nx_ich/2;
                    if(i==0)
                        onx0 = 0;
                    else
                        onx0 = nx_ich/2;
                    psr->fout_irho(n,&fout_irho,onx0,onx, output_mode);
                    fout_irho.close();
                }
                MPI_Barrier(MPI_COMM_WORLD);
            }
            ii = get_sr_for_x(xlength-x0fout);
            if (mpi_rank == ii) {
                ios_base::openmode mode = output_mode | ios_base::app;
                ofstream fout_irho(file_name.c_str(), mode);
                psr->fout_irho_yzplane(n,&fout_irho,get_xindex_in_sr(xlength-x0fout, ii), mode);
                fout_irho.close();
            }
        }
    }
}